

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_usage.cpp
# Opt level: O2

bool init_vulkan(void)

{
  VkResult __val;
  InstanceBuilder *pIVar1;
  Instance *pIVar2;
  GLFWwindow *handle;
  VkInstance instance;
  ostream *poVar3;
  PhysicalDeviceSelector *pPVar4;
  PhysicalDevice *pPVar5;
  Device *pDVar6;
  Swapchain *pSVar7;
  fd_set *__writefds;
  long lVar8;
  fd_set *__readfds;
  undefined1 uVar9;
  Swapchain *pSVar10;
  fd_set *__exceptfds;
  timeval *in_R9;
  byte bVar11;
  error_code eVar12;
  VkSurfaceKHR surface;
  Instance vkb_inst;
  Result<VkQueue_T_*> graphics_queue_ret;
  Result<vkb::Instance> inst_ret;
  Swapchain vkb_swapchain;
  SwapchainBuilder swapchain_builder;
  Result<vkb::Swapchain> swap_ret;
  InstanceBuilder builder;
  Result<vkb::Device> dev_ret;
  PhysicalDeviceSelector selector;
  Device vkb_device;
  Result<vkb::PhysicalDevice> phys_ret;
  PhysicalDevice local_dd0;
  DeviceBuilder device_builder;
  
  bVar11 = 0;
  vkb::InstanceBuilder::InstanceBuilder(&builder);
  pIVar1 = vkb::InstanceBuilder::set_app_name(&builder,"Example Vulkan Application");
  pIVar1 = vkb::InstanceBuilder::request_validation_layers(pIVar1,true);
  pIVar1 = vkb::InstanceBuilder::use_default_debug_messenger(pIVar1);
  vkb::InstanceBuilder::build(&inst_ret,pIVar1);
  if (inst_ret.m_init == false) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Failed to create Vulkan instance. Error: ");
    eVar12 = vkb::Result<vkb::Instance>::error(&inst_ret);
    (**(code **)(*(long *)eVar12._M_cat + 0x20))(&dev_ret,eVar12._M_cat,eVar12._M_value);
    poVar3 = std::operator<<(poVar3,(string *)&dev_ret);
    std::operator<<(poVar3,"\n");
  }
  else {
    pIVar2 = vkb::Result<vkb::Instance>::value(&inst_ret);
    vkb_inst.instance = pIVar2->instance;
    vkb_inst.debug_messenger = pIVar2->debug_messenger;
    vkb_inst.allocation_callbacks = pIVar2->allocation_callbacks;
    vkb_inst.fp_vkGetInstanceProcAddr = pIVar2->fp_vkGetInstanceProcAddr;
    vkb_inst.fp_vkGetDeviceProcAddr = pIVar2->fp_vkGetDeviceProcAddr;
    vkb_inst.instance_version = pIVar2->instance_version;
    vkb_inst.api_version = pIVar2->api_version;
    vkb_inst.headless = pIVar2->headless;
    vkb_inst.properties2_ext_enabled = pIVar2->properties2_ext_enabled;
    vkb_inst._50_6_ = *(undefined6 *)&pIVar2->field_0x32;
    glfwInit();
    glfwWindowHint(0x22001,0);
    __exceptfds = (fd_set *)0x0;
    handle = glfwCreateWindow(0x400,0x400,"Vulkan Triangle",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    surface = (VkSurfaceKHR)0x0;
    instance = vkb::Instance::operator_cast_to_VkInstance_T_(&vkb_inst);
    __writefds = (fd_set *)&surface;
    __val = glfwCreateWindowSurface
                      (instance,handle,(VkAllocationCallbacks *)0x0,
                       (VkSurfaceKHR_conflict *)__writefds);
    if (__val == VK_SUCCESS) {
      vkb::PhysicalDeviceSelector::PhysicalDeviceSelector(&selector,&vkb_inst);
      pPVar4 = vkb::PhysicalDeviceSelector::set_surface(&selector,surface);
      vkb::PhysicalDeviceSelector::select
                ((PhysicalDeviceSelector *)&phys_ret,(int)pPVar4,__readfds,__writefds,__exceptfds,
                 in_R9);
      if (phys_ret.m_init == false) {
        poVar3 = std::operator<<((ostream *)&std::cerr,
                                 "Failed to select Vulkan Physical Device. Error: ");
        eVar12 = vkb::Result<vkb::PhysicalDevice>::error(&phys_ret);
        (**(code **)(*(long *)eVar12._M_cat + 0x20))(&dev_ret,eVar12._M_cat,eVar12._M_value);
        poVar3 = std::operator<<(poVar3,(string *)&dev_ret);
        std::operator<<(poVar3,"\n");
        std::__cxx11::string::~string((string *)&dev_ret);
        uVar9 = 0;
      }
      else {
        pPVar5 = vkb::Result<vkb::PhysicalDevice>::value(&phys_ret);
        vkb::PhysicalDevice::PhysicalDevice(&local_dd0,pPVar5);
        vkb::DeviceBuilder::DeviceBuilder(&device_builder,&local_dd0);
        vkb::PhysicalDevice::~PhysicalDevice(&local_dd0);
        vkb::DeviceBuilder::build(&dev_ret,&device_builder);
        if (dev_ret.m_init == false) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"Failed to create Vulkan device. Error: ");
          eVar12 = vkb::Result<vkb::Device>::error(&dev_ret);
          (**(code **)(*(long *)eVar12._M_cat + 0x20))(&vkb_device,eVar12._M_cat,eVar12._M_value);
          poVar3 = std::operator<<(poVar3,(string *)&vkb_device);
          std::operator<<(poVar3,"\n");
          std::__cxx11::string::~string((string *)&vkb_device);
          uVar9 = 0;
        }
        else {
          pDVar6 = vkb::Result<vkb::Device>::value(&dev_ret);
          vkb::Device::Device(&vkb_device,pDVar6);
          vkb::Device::get_queue(&graphics_queue_ret,&vkb_device,graphics);
          if (graphics_queue_ret.m_init == false) {
            poVar3 = std::operator<<((ostream *)&std::cerr,"Failed to get graphics queue. Error: ");
            eVar12 = vkb::Result<VkQueue_T_*>::error(&graphics_queue_ret);
            (**(code **)(*(long *)eVar12._M_cat + 0x20))
                      (&swapchain_builder,eVar12._M_cat,eVar12._M_value);
            poVar3 = std::operator<<(poVar3,(string *)&swapchain_builder);
            std::operator<<(poVar3,"\n");
            std::__cxx11::string::~string((string *)&swapchain_builder);
            uVar9 = 0;
          }
          else {
            vkb::Result<VkQueue_T_*>::value(&graphics_queue_ret);
            vkb::SwapchainBuilder::SwapchainBuilder(&swapchain_builder,&vkb_device);
            vkb::SwapchainBuilder::build(&swap_ret,&swapchain_builder);
            if (swap_ret.m_init == false) {
              eVar12 = vkb::Result<vkb::Swapchain>::error(&swap_ret);
              (**(code **)(*(long *)eVar12._M_cat + 0x20))
                        (&vkb_swapchain,eVar12._M_cat,eVar12._M_value);
              poVar3 = std::operator<<((ostream *)&std::cout,(string *)&vkb_swapchain);
              std::operator<<(poVar3,"\n");
              std::__cxx11::string::~string((string *)&vkb_swapchain);
            }
            else {
              pSVar7 = vkb::Result<vkb::Swapchain>::value(&swap_ret);
              pSVar10 = &vkb_swapchain;
              for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
                pSVar10->device = pSVar7->device;
                pSVar7 = (Swapchain *)((long)pSVar7 + (ulong)bVar11 * -0x10 + 8);
                pSVar10 = (Swapchain *)((long)pSVar10 + (ulong)bVar11 * -0x10 + 8);
              }
              vkb::destroy_swapchain(&vkb_swapchain);
              vkb::destroy_device(&vkb_device);
              vkb::destroy_surface(&vkb_inst,surface);
              vkb::destroy_instance(&vkb_inst);
              glfwDestroyWindow(handle);
              glfwTerminate();
            }
            vkb::SwapchainBuilder::SwapchainInfo::~SwapchainInfo(&swapchain_builder.info);
            uVar9 = swap_ret.m_init;
          }
          vkb::Device::~Device(&vkb_device);
        }
        vkb::Result<vkb::Device>::destroy(&dev_ret);
        vkb::DeviceBuilder::~DeviceBuilder(&device_builder);
      }
      vkb::Result<vkb::PhysicalDevice>::destroy(&phys_ret);
      vkb::PhysicalDeviceSelector::SelectionCriteria::~SelectionCriteria(&selector.criteria);
      goto LAB_00108f51;
    }
    poVar3 = std::operator<<((ostream *)&std::cerr,"Failed to select create window surface. Error: "
                            );
    std::__cxx11::to_string((string *)&dev_ret,__val);
    poVar3 = std::operator<<(poVar3,(string *)&dev_ret);
    std::operator<<(poVar3,"\n");
  }
  std::__cxx11::string::~string((string *)&dev_ret);
  uVar9 = 0;
LAB_00108f51:
  vkb::InstanceBuilder::InstanceInfo::~InstanceInfo(&builder.info);
  return (bool)uVar9;
}

Assistant:

bool init_vulkan() {
    vkb::InstanceBuilder builder;
    auto inst_ret =
        builder.set_app_name("Example Vulkan Application").request_validation_layers().use_default_debug_messenger().build();
    if (!inst_ret) {
        std::cerr << "Failed to create Vulkan instance. Error: " << inst_ret.error().message() << "\n";
        return false;
    }
    vkb::Instance vkb_inst = inst_ret.value();

    glfwInit();
    glfwWindowHint(GLFW_CLIENT_API, GLFW_NO_API);
    GLFWwindow* window = glfwCreateWindow(1024, 1024, "Vulkan Triangle", NULL, NULL);

    VkSurfaceKHR surface = VK_NULL_HANDLE;
    VkResult glfw_result = glfwCreateWindowSurface(vkb_inst, window, nullptr, &surface);
    if (glfw_result != VK_SUCCESS) {
        std::cerr << "Failed to select create window surface. Error: " << std::to_string(glfw_result) << "\n";
        return false;
    }

    vkb::PhysicalDeviceSelector selector{ vkb_inst };
    auto phys_ret = selector.set_surface(surface).select();
    if (!phys_ret) {
        std::cerr << "Failed to select Vulkan Physical Device. Error: " << phys_ret.error().message() << "\n";
        return false;
    }

    vkb::DeviceBuilder device_builder{ phys_ret.value() };
    // automatically propagate needed data from instance & physical device
    auto dev_ret = device_builder.build();
    if (!dev_ret) {
        std::cerr << "Failed to create Vulkan device. Error: " << dev_ret.error().message() << "\n";
        return false;
    }
    vkb::Device vkb_device = dev_ret.value();

    // Get the VkDevice handle used in the rest of a vulkan application
    VkDevice device = vkb_device.device;

    // Get the graphics queue with a helper function
    auto graphics_queue_ret = vkb_device.get_queue(vkb::QueueType::graphics);
    if (!graphics_queue_ret) {
        std::cerr << "Failed to get graphics queue. Error: " << graphics_queue_ret.error().message() << "\n";
        return false;
    }
    VkQueue graphics_queue = graphics_queue_ret.value();

    vkb::SwapchainBuilder swapchain_builder{ vkb_device };
    auto swap_ret = swapchain_builder.build();
    if (!swap_ret) {
        std::cout << swap_ret.error().message() << "\n";
        return false;
    }
    vkb::Swapchain vkb_swapchain = swap_ret.value();

    // We did it!
    // Turned 400-500 lines of boilerplate into a fraction of that.

    // Time to cleanup
    vkb::destroy_swapchain(vkb_swapchain);
    vkb::destroy_device(vkb_device);
    vkb::destroy_surface(vkb_inst, surface);
    vkb::destroy_instance(vkb_inst);
    glfwDestroyWindow(window);
    glfwTerminate();
    (void)device; // silence unused warning
    (void)graphics_queue;
    return true;
}